

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_202012.hpp
# Opt level: O0

schema_validator_ptr_type __thiscall
jsoncons::jsonschema::draft202012::
schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_schema_validator
          (schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          keys,anchor_uri_map_type *anchor_dict)

{
  json_type jVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RSI;
  _Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  uri_wrapper *uri_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *__range5_1;
  schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *p_1
  ;
  uri_wrapper *uri;
  const_iterator __end0;
  const_iterator __begin0;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *__range5;
  schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *p;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  new_context;
  schema_validator_ptr_type *schema_validator_ptr;
  anchor_uri_map_type *in_stack_00001c60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00001c68;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00001c70;
  schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00001c78;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *in_stack_fffffffffffffca8;
  schema_error *this_00;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd70;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd78;
  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
  local_270;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *local_268;
  pointer local_260;
  reference local_250;
  uri_wrapper *local_248;
  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
  local_240;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  *local_238;
  pointer local_230;
  undefined1 local_209;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  local_1f0;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = (undefined4)in_R8;
  uStack_14 = (undefined4)((ulong)in_R8 >> 0x20);
  uStack_10 = (undefined4)in_R9;
  uStack_c = (undefined4)((ulong)in_R9 >> 0x20);
  local_208 = local_18;
  uStack_204 = uStack_14;
  uStack_200 = uStack_10;
  uStack_1fc = uStack_c;
  this_00 = (schema_error *)in_RDI._M_head_impl;
  (**(code **)(*(long *)&in_RSI->base_uri_ + 0x10))(&local_1f0,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  local_209 = 0;
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
  ::
  unique_ptr<std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,void>
            ((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_RDI._M_head_impl);
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RSI);
  if (jVar1 == bool_value) {
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::make_boolean_schema
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_RDI._M_head_impl,
                (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffca8);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)this_00);
    local_230 = std::
                unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                ::get((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_RDI._M_head_impl);
    local_238 = compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::uris(&local_1f0);
    local_240._M_current =
         (uri_wrapper *)
         std::
         vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ::begin(in_stack_fffffffffffffca8);
    local_248 = (uri_wrapper *)
                std::
                vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                ::end(in_stack_fffffffffffffca8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                               *)in_RDI._M_head_impl,
                              (__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                               *)in_stack_fffffffffffffca8), bVar2) {
      local_250 = __gnu_cxx::
                  __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                  ::operator*(&local_240);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::insert_schema(in_stack_fffffffffffffcd0,
                      (uri_wrapper *)
                      CONCAT17(in_stack_fffffffffffffccf,CONCAT16(jVar1,in_stack_fffffffffffffcc8)),
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)this_00);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator++(&local_240);
    }
  }
  else {
    if (jVar1 != object_value) {
      uVar3 = __cxa_allocate_exception(0x18);
      compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::get_base_uri(in_RSI);
      jsoncons::uri::string_abi_cxx11_((uri *)&stack0xfffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcd8,(char *)in_stack_fffffffffffffcd0);
      schema_error::schema_error(this_00,(string *)in_RSI);
      __cxa_throw(uVar3,&schema_error::typeinfo,schema_error::~schema_error);
    }
    make_object_schema_validator
              (in_stack_00001c78,in_stack_00001c70,in_stack_00001c68,in_stack_00001c60);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_RDI._M_head_impl,
                (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffca8);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)this_00);
    local_260 = std::
                unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                ::get((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_RDI._M_head_impl);
    local_268 = compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::uris(&local_1f0);
    local_270._M_current =
         (uri_wrapper *)
         std::
         vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ::begin(in_stack_fffffffffffffca8);
    std::
    vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>::
    end(in_stack_fffffffffffffca8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                               *)in_RDI._M_head_impl,
                              (__normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
                               *)in_stack_fffffffffffffca8), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator*(&local_270);
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::insert_schema(in_stack_fffffffffffffcd0,
                      (uri_wrapper *)
                      CONCAT17(in_stack_fffffffffffffccf,CONCAT16(jVar1,in_stack_fffffffffffffcc8)),
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)this_00);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::jsonschema::uri_wrapper_*,_std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>_>
      ::operator++(&local_270);
    }
  }
  local_209 = 1;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  ~compilation_context
            ((compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )in_RDI._M_head_impl;
}

Assistant:

schema_validator_ptr_type make_schema_validator(const compilation_context<Json>& context, 
            const Json& sch, jsoncons::span<const std::string> keys, anchor_uri_map_type& anchor_dict) override
        {
            auto new_context = make_compilation_context(context, sch, keys);
            //std::cout << "this->make_cross_draft_schema_validator " << context.get_base_uri().string() << ", " << new_context.get_base_uri().string() << "\n\n";

            schema_validator_ptr_type schema_validator_ptr;

            switch (sch.type())
            {
                case json_type::bool_value:
                {
                    schema_validator_ptr = this->make_boolean_schema(new_context, sch);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                    }          
                    break;
                }
                case json_type::object_value:
                {
                    schema_validator_ptr = make_object_schema_validator(new_context, sch, anchor_dict);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                        /*for (const auto& item : sch.object_range())
                        {
                            if (known_keywords().find(item.key()) == known_keywords().end())
                            {
                                std::cout << "  " << item.key() << "\n";
                                this->insert_unknown_keyword(uri, item.key(), item.value()); // save unknown keywords for later reference
                            }
                        }*/
                    }          
                    break;
                }
                default:
                    JSONCONS_THROW(schema_error(new_context.get_base_uri().string() + ": Invalid JSON-type for a schema, expected: boolean or object"));
                    break;
            }
            
            return schema_validator_ptr;
        }